

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTcSymBif::gen_code_call(CTcSymBif *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  uint16_t tmp;
  undefined8 in_RAX;
  ulong uVar2;
  undefined4 in_register_0000000c;
  undefined *__n;
  void *__buf;
  undefined1 uVar3;
  undefined1 *puVar4;
  int iVar5;
  CTcGenTarg *pCVar6;
  char buf [2];
  undefined8 local_38;
  
  __n = (undefined *)CONCAT44(in_register_0000000c,varargs);
  if ((~G_cg->field_0xd0 & 0x18) != 0) {
    iVar5 = 0x2cf9;
    local_38 = in_RAX;
    if ((argc < (this->super_CTcSymBifBase).min_argc_) ||
       ((((this->super_CTcSymBifBase).field_0x34 & 1) == 0 &&
        (iVar5 = 0x2cfa, (this->super_CTcSymBifBase).max_argc_ < argc)))) {
      CTcTokenizer::log_error
                (iVar5,(ulong)(uint)(this->super_CTcSymBifBase).super_CTcSymbol.super_CTcSymbolBase.
                                    super_CVmHashEntryCS.super_CVmHashEntry.len_,
                 (this->super_CTcSymBifBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.str_);
    }
    if (varargs != 0) {
      CTcGenTarg::write_op(G_cg,'v');
    }
    uVar2 = (ulong)(this->super_CTcSymBifBase).func_set_id_;
    uVar3 = (undefined1)argc;
    if ((uVar2 < 4) && ((this->super_CTcSymBifBase).func_idx_ < 0x100)) {
      __n = &DAT_002facb7;
      CTcGenTarg::write_op(G_cg,(&DAT_002facb7)[uVar2]);
      local_38 = CONCAT71(local_38._1_7_,uVar3);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_38,(void *)0x1,(size_t)__n);
      uVar3 = (undefined1)(this->super_CTcSymBifBase).func_idx_;
      puVar4 = (undefined1 *)((long)&local_38 + 1);
    }
    else {
      if ((this->super_CTcSymBifBase).func_idx_ < 0x100) {
        CTcGenTarg::write_op(G_cg,0xb5);
        local_38._0_3_ = CONCAT12(uVar3,(undefined2)local_38);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_38 + 2,(void *)0x1,(size_t)__n);
        iVar5 = (int)&local_38 + 3;
        local_38._0_4_ = CONCAT13((char)(this->super_CTcSymBifBase).func_idx_,(undefined3)local_38);
        __buf = (void *)0x1;
      }
      else {
        CTcGenTarg::write_op(G_cg,0xb6);
        local_38._0_5_ = CONCAT14(uVar3,(undefined4)local_38);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_38 + 4,(void *)0x1,(size_t)__n);
        iVar5 = (int)&local_38 + 6;
        local_38 = CONCAT26((this->super_CTcSymBifBase).func_idx_,(undefined6)local_38);
        __buf = (void *)0x2;
      }
      CTcDataStream::write(&G_cs->super_CTcDataStream,iVar5,__buf,(size_t)__n);
      uVar3 = (undefined1)(this->super_CTcSymBifBase).func_set_id_;
      puVar4 = (undefined1 *)((long)&local_38 + 5);
    }
    *puVar4 = uVar3;
    pCVar6 = (CTcGenTarg *)G_cs;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)puVar4,(void *)0x1,(size_t)__n);
    G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
    CTcGenTarg::post_call_cleanup(pCVar6,named_args);
    if (discard == 0) {
      CTcGenTarg::write_op(G_cg,0x8b);
      pCVar6 = G_cg;
      iVar1 = G_cg->sp_depth_;
      iVar5 = iVar1 + 1;
      G_cg->sp_depth_ = iVar5;
      if (pCVar6->max_sp_depth_ <= iVar1) {
        pCVar6->max_sp_depth_ = iVar5;
      }
    }
    return;
  }
  err_throw(0x9c5);
}

Assistant:

void CTcSymBif::gen_code_call(int discard, int argc, int varargs,
                              CTcNamedArgs *named_args)
{
    /* don't allow calling built-in functions in speculative mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);
    
    /* check for minimum and maximum arguments */
    if (argc < min_argc_)
    {
        G_tok->log_error(TCERR_TOO_FEW_FUNC_ARGS,
                         (int)get_sym_len(), get_sym());
    }
    else if (!varargs_ && argc > max_argc_)
    {
        G_tok->log_error(TCERR_TOO_MANY_FUNC_ARGS,
                         (int)get_sym_len(), get_sym());
    }

    /* write the varargs modifier if appropriate */
    if (varargs)
        G_cg->write_op(OPC_VARARGC);

    /* generate the call */
    if (get_func_set_id() < 4 && get_func_idx() < 256)
    {
        uchar short_ops[] =
            { OPC_BUILTIN_A, OPC_BUILTIN_B, OPC_BUILTIN_C, OPC_BUILTIN_D };
        
        /* 
         *   it's one of the first 256 functions in one of the first four
         *   function sets - we can generate a short instruction 
         */
        G_cg->write_op(short_ops[get_func_set_id()]);
        G_cs->write((char)argc);
        G_cs->write((char)get_func_idx());
    }
    else
    {
        /* it's not in the default set - use the longer instruction */
        if (get_func_idx() < 256)
        {
            /* low function index - write the short form */
            G_cg->write_op(OPC_BUILTIN1);
            G_cs->write((char)argc);
            G_cs->write((char)get_func_idx());
        }
        else
        {
            /* big function index - write the long form */
            G_cg->write_op(OPC_BUILTIN2);
            G_cs->write((char)argc);
            G_cs->write2(get_func_idx());
        }

        /* write the function set ID */
        G_cs->write((char)get_func_set_id());
    }

    /* the built-in functions always remove arguments */
    G_cg->note_pop(argc);

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* 
     *   if they're not discarding the value, push it - the value is
     *   sitting in R0 after the call returns
     */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}